

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

void charmap_Add(char *mapping,uint8_t value)

{
  size_t sVar1;
  char cVar2;
  long lVar3;
  Charmap *pCVar4;
  char *pcVar5;
  Charmap *pCVar6;
  
  pCVar6 = *currentCharmap;
  pCVar4 = pCVar6 + 1;
  cVar2 = *mapping;
  if (cVar2 != '\0') {
    pcVar5 = mapping + 1;
    do {
      if ((&pCVar4->usedNodes)[(byte)(cVar2 - 1U)] == 0) {
        (&pCVar4->usedNodes)[(byte)(cVar2 - 1U)] = pCVar6->usedNodes;
        if (pCVar6->usedNodes == pCVar6->capacity) {
          sVar1 = pCVar6->capacity * 2;
          pCVar6->capacity = sVar1;
          resizeCharmap(currentCharmap,sVar1);
          pCVar6 = *currentCharmap;
        }
        sVar1 = pCVar6->usedNodes;
        pCVar6->usedNodes = sVar1 + 1;
        lVar3 = sVar1 * 0x800;
        pCVar4 = (Charmap *)((long)pCVar6 + lVar3 + 0x18);
        *(undefined1 *)&pCVar4->name = 0;
        memset((void *)((long)pCVar6 + lVar3 + 0x20),0,0x7f8);
      }
      else {
        pCVar4 = (Charmap *)((long)pCVar6 + (&pCVar4->usedNodes)[(byte)(cVar2 - 1U)] * 0x800 + 0x18)
        ;
      }
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar2 != '\0');
  }
  if (*(char *)&pCVar4->name != '\0') {
    warning(WARNING_CHARMAP_REDEF,"Overriding charmap mapping\n");
  }
  *(undefined1 *)&pCVar4->name = 1;
  *(uint8_t *)((long)&pCVar4->name + 1) = value;
  return;
}

Assistant:

void charmap_Add(char *mapping, uint8_t value)
{
	struct Charmap *charmap = *currentCharmap;
	struct Charnode *node = &charmap->nodes[0];

	for (uint8_t c; *mapping; mapping++) {
		c = *mapping - 1;

		if (node->next[c]) {
			node = &charmap->nodes[node->next[c]];
		} else {
			// Register next available node
			node->next[c] = charmap->usedNodes;
			// If no more nodes are available, get new ones
			if (charmap->usedNodes == charmap->capacity) {
				charmap->capacity *= 2;
				resizeCharmap(currentCharmap, charmap->capacity);
				charmap = *currentCharmap;
			}

			// Switch to and init new node
			node = &charmap->nodes[charmap->usedNodes++];
			initNode(node);
		}
	}

	if (node->isTerminal)
		warning(WARNING_CHARMAP_REDEF, "Overriding charmap mapping\n");

	node->isTerminal = true;
	node->value = value;
}